

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O1

bool __thiscall features::Surf::descriptor_orientation(Surf *this,Descriptor *descr)

{
  float *dy_00;
  float fVar1;
  float __x;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int i;
  int x;
  int iVar11;
  int iVar12;
  int iVar13;
  int rx;
  int iVar14;
  float *dx_00;
  undefined4 uVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  float local_418 [2];
  float dx [109];
  float local_258 [2];
  float dy [109];
  undefined8 local_88;
  double local_78;
  double local_40;
  
  iVar11 = (int)(descr->x + 0.5);
  iVar12 = (int)(descr->y + 0.5);
  iVar13 = (int)descr->scale;
  peVar2 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = iVar13 * 8;
  bVar3 = iVar11 + iVar13 * 8 + 1 < (peVar2->super_TypedImageBase<long>).super_ImageBase.w;
  bVar4 = iVar12 + iVar13 * 8 + 1 < (peVar2->super_TypedImageBase<long>).super_ImageBase.h;
  if (bVar4 && (bVar3 && (iVar8 < iVar12 && iVar8 < iVar11))) {
    iVar9 = 0;
    iVar7 = -5;
    do {
      iVar14 = -5;
      x = iVar11 + iVar13 * -5;
      do {
        if ((uint)(iVar14 * iVar14 + iVar7 * iVar7) < 0x24) {
          lVar10 = (long)iVar9;
          dx_00 = local_418 + lVar10;
          dy_00 = local_258 + lVar10;
          filter_dx_dy(this,x,iVar7 * iVar13 + iVar12,iVar13 * 2,dx_00,dy_00);
          fVar1 = *(float *)(&DAT_001213e0 + lVar10 * 4);
          *dx_00 = *dx_00 * fVar1;
          *dy_00 = fVar1 * *dy_00;
          iVar9 = iVar9 + 1;
        }
        iVar14 = iVar14 + 1;
        x = x + iVar13;
      } while (iVar14 != 6);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 6);
    dVar22 = -3.141592653589793;
    uVar15 = 0;
    uVar17 = 0;
    uVar18 = 0;
    uVar19 = 0;
    local_40 = 0.0;
    dVar24 = 0.0;
    do {
      dVar6 = local_40;
      stack0xffffffffffffff60 = dVar24;
      local_88 = CONCAT44(uVar17,uVar15);
      dVar24 = dVar22 + -0.5235987755982988;
      dVar20 = dVar22 + 0.5235987755982988;
      lVar10 = 0;
      local_78 = 0.0;
      local_40 = 0.0;
      do {
        fVar1 = local_258[lVar10];
        __x = local_418[lVar10];
        fVar16 = atan2f(fVar1,__x);
        dVar21 = (double)fVar16;
        if ((((dVar24 < dVar21) && (dVar21 < dVar20)) ||
            ((dVar24 < dVar21 + 6.283185307179586 && (dVar21 + 6.283185307179586 < dVar20)))) ||
           ((dVar24 < dVar21 + -6.283185307179586 && (dVar21 + -6.283185307179586 < dVar20)))) {
          local_40 = local_40 + (double)__x;
          local_78 = local_78 + (double)fVar1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x6d);
      dVar24 = local_40 * local_40 + local_78 * local_78;
      if (dVar24 <= stack0xffffffffffffff60) {
        local_40 = dVar6;
      }
      auVar23._12_4_ = uVar19;
      auVar23._8_4_ = uVar18;
      auVar23._0_8_ = ~-(ulong)(stack0xffffffffffffff60 < dVar24) & local_88;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)local_78 & -(ulong)(stack0xffffffffffffff60 < dVar24);
      auVar23 = auVar23 | auVar5;
      uVar15 = auVar23._0_4_;
      uVar17 = auVar23._4_4_;
      uVar18 = auVar23._8_4_;
      uVar19 = auVar23._12_4_;
      if (dVar24 <= stack0xffffffffffffff60) {
        dVar24 = stack0xffffffffffffff60;
      }
      dVar22 = dVar22 + 0.39269908169872414;
    } while (dVar22 < 3.141592653589793);
    dVar24 = atan2(auVar23._0_8_,local_40);
    descr->orientation = (float)dVar24;
  }
  return bVar4 && (bVar3 && (iVar8 < iVar12 && iVar8 < iVar11));
}

Assistant:

bool
Surf::descriptor_orientation (Descriptor* descr)
{
    int const descr_x = static_cast<int>(descr->x + 0.5f);
    int const descr_y = static_cast<int>(descr->y + 0.5f);
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Pre-computed gaussian weights for the (circular) window. The gaussian
     * is computed as exp((dx^2 + dy^2) / (2 * sigma^2) with sigma = 2.5.
     */
    float const gaussian[109] = { 0.0658748, 0.0982736, 0.12493, 0.135335,
        0.12493, 0.0982736, 0.0658748, 0.0773047, 0.135335, 0.201897, 0.256661,
        0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748, 0.135335,
        0.236928, 0.353455, 0.449329, 0.486752, 0.449329, 0.353455, 0.236928,
        0.135335, 0.0658748, 0.0982736, 0.201897, 0.353455, 0.527292, 0.67032,
        0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.135335, 0.278037, 0.486752, 0.726149,
        0.923116, 1, 0.923116, 0.726149, 0.486752, 0.278037, 0.135335, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.0982736, 0.201897, 0.353455, 0.527292,
        0.67032, 0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736,
        0.0658748, 0.135335, 0.236928, 0.353455, 0.449329, 0.486752, 0.449329,
        0.353455, 0.236928, 0.135335, 0.0658748, 0.0773047, 0.135335, 0.201897,
        0.256661, 0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748,
        0.0982736, 0.12493, 0.135335, 0.12493, 0.0982736, 0.0658748 };

    /*
     * At least a 12 * scale pixel kernel for the support circle is needed.
     * Additionally, computing the Haar Wavelet response uses a kernel size
     * of 4 * scale pixel. That makes a total of (6 + 2) * scale pixel on
     * either side of the kernel spacing. One additional pixel is needed
     * to the upper-left side to simplify integral image access.
     */
    int const spacing = 8 * descr_scale + 1;
    if (descr_x < spacing || descr_y < spacing
        || descr_x + spacing >= width || descr_y + spacing >= height)
        return false;

    /* The number of samples is constant, depending on radius. */
#define NUM_SAMPLES 109
    float dx[NUM_SAMPLES], dy[NUM_SAMPLES];

    /*
     * Iterate over the pixels of a circle with radius 6 * scale
     * and compute Haar Wavelet responses in x- and y-direction.
     */
    for (int ry = -5, index = 0; ry <= 5; ++ry)
        for (int rx = -5; rx <= 5; ++rx)
        {
            if (rx * rx + ry * ry >= 36)
                continue;
            this->filter_dx_dy(descr_x + rx * descr_scale,
                descr_y + ry * descr_scale, 2 * descr_scale,
                dx + index, dy + index);
            dx[index] *= gaussian[index];
            dy[index] *= gaussian[index];
            index += 1;
        }

    /*
     * Iterate in a sliding window over the 109 extracted samples
     * in order to find a dominant orientation for the keypoint.
     */
    double const window_increment = MATH_PI / 8.0;
    double const window_halfsize = MATH_PI / 6.0;
    double best_dx = 0.0, best_dy = 0.0;
    double best_length = 0.0f;
    for (double deg = -MATH_PI; deg < MATH_PI; deg += window_increment)
    {
        /* Evaluate samples for this window. */
        double const win_start = deg - window_halfsize;
        double const win_end = deg + window_halfsize;
        double sum_dx = 0.0f, sum_dy = 0.0f;
        for (int i = 0; i < NUM_SAMPLES; ++i)
        {
            double const sample_deg = std::atan2(dy[i], dx[i]);
            double const sample_deg_p = sample_deg + 2.0 * MATH_PI;
            double const sample_deg_m = sample_deg - 2.0 * MATH_PI;
            if ((sample_deg > win_start && sample_deg < win_end)
                || (sample_deg_p > win_start && sample_deg_p < win_end)
                || (sample_deg_m > win_start && sample_deg_m < win_end))
            {
                sum_dx += dx[i];
                sum_dy += dy[i];
            }
        }

        /* Total vector length of dx/dy sums defines dominance. */
        double const length = sum_dx * sum_dx + sum_dy * sum_dy;
        if (length > best_length)
        {
            best_dx = sum_dx;
            best_dy = sum_dy;
            best_length = length;
        }
    }

    /* TODO: Threshold on the vector length? */
    descr->orientation = std::atan2(best_dy, best_dx);
    return true;
}